

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChakraRtInterface.cpp
# Opt level: O3

void ChakraRTInterface::UnloadChakraDll(HINSTANCE library)

{
  BSTR sourceString;
  HRESULT HVar1;
  FARPROC UNRECOVERED_JUMPTABLE;
  size_t sourceCount;
  char **destStringPtr;
  size_t sStack_40;
  BSTR pWStack_38;
  
  if (library != (HINSTANCE)0x0) {
    UNRECOVERED_JUMPTABLE = GetProcAddress(library,"DllCanUnloadNow");
    if (UNRECOVERED_JUMPTABLE != (FARPROC)0x0) {
      (*UNRECOVERED_JUMPTABLE)();
    }
    UNRECOVERED_JUMPTABLE = GetProcAddress(library,"DllMain");
    if (UNRECOVERED_JUMPTABLE == (FARPROC)0x0) {
      return;
    }
    (*UNRECOVERED_JUMPTABLE)(library,0,0);
    return;
  }
  UnloadChakraDll();
  if ((m_testHooks.pfSetAssertToConsoleFlag != (SetAssertToConsoleFlagPtr)0x0) &&
     (m_testHooksSetup == true)) {
    library = (BSTR)0x1;
    (*m_testHooks.pfSetAssertToConsoleFlag)(true);
  }
  if (m_testHooks.pfSetConfigFlags == (SetConfigFlagsPtr)0x0) {
LAB_0010ad3c:
    m_argInfo->filename = (char *)0x0;
    if (m_testHooks.pfGetFilenameFlag == (_func_HRESULT_BSTR_ptr *)0x0) {
      ParseConfigFlags();
LAB_0010ae06:
      ParseConfigFlags();
      if (m_testHooksInitialized == false) {
        memcpy(&m_testHooks,library,0x2a50);
        m_testHooksSetup = true;
        m_testHooksInitialized = true;
        ParseConfigFlags();
        return;
      }
      return;
    }
    pWStack_38 = (char16_t *)0x0;
    if ((m_testHooksSetup == true) &&
       (HVar1 = (*m_testHooks.pfGetFilenameFlag)(&pWStack_38), sourceString = pWStack_38, HVar1 == 0
       )) {
      destStringPtr = &m_argInfo->filename;
      sourceCount = PAL_wcslen(pWStack_38);
      HVar1 = utf8::WideStringToNarrow<void*(*)(unsigned_long)>
                        (utf8::malloc_allocator::allocate,sourceString,sourceCount,destStringPtr,
                         &sStack_40,(size_t *)0x0);
      library = pWStack_38;
      SysFreeString(pWStack_38);
      if (HVar1 < 0) {
        if (HVar1 != -0x7ff8fff2) goto LAB_0010ae06;
        PAL_wprintf(L"Error: Ran out of memory");
      }
    }
    else {
      PAL_wprintf(L"Error: no script file specified.");
      (*m_argInfo->hostPrintUsage)();
      m_usageStringPrinted = true;
    }
  }
  else {
    if (m_testHooksSetup == true) {
      library = (HINSTANCE)(ulong)(uint)m_argInfo->argc;
      HVar1 = (*m_testHooks.pfSetConfigFlags)
                        (m_argInfo->argc,m_argInfo->argv,
                         &HostConfigFlags::flags.super_ICustomConfigFlags);
      if (HVar1 == 0) goto LAB_0010ad3c;
    }
    if (m_usageStringPrinted == false) {
      (*m_argInfo->hostPrintUsage)();
      m_usageStringPrinted = true;
    }
  }
  return;
}

Assistant:

void ChakraRTInterface::UnloadChakraDll(HINSTANCE library)
{
#ifndef CHAKRA_STATIC_LIBRARY
    Assert(library != nullptr);
    FARPROC pDllCanUnloadNow = (FARPROC) GetChakraCoreSymbol(library, "DllCanUnloadNow");
    if (pDllCanUnloadNow != nullptr)
    {
        pDllCanUnloadNow();
    }
#ifdef _WIN32
    UnloadChakraCore(library);
#else  // !_WIN32
    // PAL thread shutdown needs more time after execution completion.
    // Do not FreeLibrary. Invoke DllMain(DLL_PROCESS_DETACH) directly.
    typedef BOOL (__stdcall *PDLLMAIN)(HINSTANCE, DWORD, LPVOID);
    PDLLMAIN pDllMain = (PDLLMAIN) GetChakraCoreSymbol(library, "DllMain");
    if (pDllMain)
    {
        pDllMain(library, DLL_PROCESS_DETACH, NULL);
    }
#endif
#endif
}